

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O0

Filter * helics::make_filter(FilterTypes type,Federate *mFed,string_view name)

{
  string_view inputType;
  string_view inputType_00;
  string_view filterName;
  string_view filterName_00;
  string_view outputType;
  string_view outputType_00;
  Filter *pFVar1;
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *this;
  size_t in_RCX;
  char *in_RDX;
  Federate *in_RSI;
  int in_EDI;
  Filter *dfilt;
  FilterTypes in_stack_0000007c;
  Filter *in_stack_00000080;
  Filter *dfilt_1;
  char *in_stack_ffffffffffffff18;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff20;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_a8 [2];
  Filter *local_88;
  undefined8 local_70;
  undefined8 local_68;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  Federate *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  size_t sVar2;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  char *pcVar3;
  Filter *local_8;
  
  if (in_EDI == 5) {
    sVar2 = in_RCX;
    pcVar3 = in_RDX;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffb0);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60);
    filterName._M_str = in_stack_ffffffffffffffd0;
    filterName._M_len = sVar2;
    inputType._M_str = in_RDX;
    inputType._M_len = (size_t)in_stack_ffffffffffffffb8;
    outputType._M_len._4_4_ = in_EDI;
    outputType._M_len._0_4_ = in_stack_ffffffffffffffe0;
    outputType._M_str = pcVar3;
    pFVar1 = &Federate::registerCloningFilter
                        (in_stack_ffffffffffffffb0,filterName,inputType,outputType)->super_Filter;
    this = &Federate::getCorePointer(in_RSI)->
            super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::get(this);
    addOperations(in_stack_00000080,in_stack_0000007c,(Core *)dfilt);
    local_8 = pFVar1;
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    (*(((Filter *)&pFVar1->super_Interface)->super_Interface)._vptr_Interface[6])
              (pFVar1,local_70,local_68,pcVar3,in_RCX);
  }
  else {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_a8);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8);
    filterName_00._M_str = in_stack_ffffffffffffffd0;
    filterName_00._M_len = in_stack_ffffffffffffffc8;
    inputType_00._M_str = in_stack_ffffffffffffffc0;
    inputType_00._M_len = (size_t)in_stack_ffffffffffffffb8;
    outputType_00._M_len._4_4_ = in_EDI;
    outputType_00._M_len._0_4_ = in_stack_ffffffffffffffe0;
    outputType_00._M_str = in_RDX;
    local_88 = Federate::registerFilter
                         (in_stack_ffffffffffffffb0,filterName_00,inputType_00,outputType_00);
    addOperations(in_stack_00000080,in_stack_0000007c,(Core *)dfilt);
    local_8 = local_88;
  }
  return local_8;
}

Assistant:

Filter& make_filter(FilterTypes type, Federate* mFed, std::string_view name)
{
    if (type == FilterTypes::CLONE) {
        Filter& dfilt = mFed->registerCloningFilter(name);
        addOperations(&dfilt, type, mFed->getCorePointer().get());
        dfilt.setString("delivery", name);
        return dfilt;
    }
    auto& dfilt = mFed->registerFilter(name);
    addOperations(&dfilt, type, nullptr);
    return dfilt;
}